

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O2

econf_err getUInt64ValueNum(econf_file key_file,size_t num,uint64_t *result)

{
  econf_err eVar1;
  int *piVar2;
  ulonglong uVar3;
  char *endptr;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  uVar3 = strtoull(key_file.file_entry[num].value,&endptr,0);
  *result = uVar3;
  eVar1 = ECONF_VALUE_CONVERSION_ERROR;
  if ((endptr != key_file.file_entry[num].value) &&
     ((*piVar2 == 0 || ((*piVar2 != 0x22 && (uVar3 != 0)))))) {
    eVar1 = ECONF_SUCCESS;
  }
  return eVar1;
}

Assistant:

econf_err getUInt64ValueNum(econf_file key_file, size_t num, uint64_t *result) {
  char *endptr;
  errno = 0;
  *result = strtoull(key_file.file_entry[num].value, &endptr, 0);
  if (endptr == key_file.file_entry[num].value || errno == ERANGE || (errno != 0 && *result == 0))
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}